

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O2

void __thiscall Bob::UpdateAlphas(Bob *this)

{
  int iVar1;
  uint uVar2;
  pointer plVar3;
  pointer plVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  ulong uVar9;
  ulong uVar10;
  pointer pvVar11;
  ulong uVar12;
  int i;
  long lVar13;
  
  iVar1 = (this->super_Party).n_p;
  plVar3 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar11 = (this->super_Party).P.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  plVar4 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (ulong)(uint)(this->super_Party).alpha_rc;
  for (lVar13 = 0; lVar13 < iVar1; lVar13 = lVar13 + 1) {
    *(long *)(*(long *)&(pvVar11->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data + 0x20) = plVar3[(int)uVar10];
    auVar5._8_4_ = 0;
    auVar5._0_8_ = (long)plVar4 - (long)plVar3 >> 3;
    auVar7._8_4_ = 0;
    auVar7._0_8_ = (long)((int)uVar10 + 1);
    uVar10 = SUB128(auVar7 % auVar5,0);
    (this->super_Party).alpha_rc = SUB124(auVar7 % auVar5,0);
    pvVar11 = pvVar11 + 1;
  }
  uVar2 = (this->super_Party).n_d;
  plVar3 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar11 = (this->super_Party).D.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  plVar4 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = 0;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = uVar12;
  }
  for (; uVar9 * 0x18 - uVar12 != 0; uVar12 = uVar12 + 0x18) {
    *(long *)(*(long *)((long)&(pvVar11->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data + uVar12) + 8) = plVar3[(int)uVar10];
    auVar6._8_4_ = 0;
    auVar6._0_8_ = (long)plVar4 - (long)plVar3 >> 3;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = (long)((int)uVar10 + 1);
    uVar10 = SUB128(auVar8 % auVar6,0);
    (this->super_Party).alpha_rc = SUB124(auVar8 % auVar6,0);
  }
  return;
}

Assistant:

void Bob::UpdateAlphas()
{
    for(int i = 0; i < n_p; i++)
    {
        P[i][4] = AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size();
    }    
    for(int i = 0; i < n_d; i++)
    {
        D[i][1] = AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size();
    }   
}